

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

QRect __thiscall
QPixmapStyle::comboBoxSubControlRect
          (QPixmapStyle *this,QStyleOptionComplex *option,SubControl sc,QWidget *param_4)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int in_EDX;
  long in_FS_OFFSET;
  QRect QVar4;
  QPixmapStyleDescriptor *desc;
  QPixmapStylePixmap *pix;
  QPixmapStylePrivate *d;
  QRect r;
  int in_stack_fffffffffffffecc;
  int in_stack_fffffffffffffed0;
  int in_stack_fffffffffffffed4;
  int in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  int in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffee4;
  int in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  int in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  LayoutDirection in_stack_fffffffffffffefc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QPixmapStyle *)0x401938);
  QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
            ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (ControlPixmap *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
            ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
             (ControlDescriptor *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  if (in_EDX == 2) {
    iVar2 = QMargins::left((QMargins *)0x401acc);
    iVar3 = QMargins::right((QMargins *)0x401ade);
    in_stack_fffffffffffffee8 = QMargins::right((QMargins *)0x401af0);
    in_stack_fffffffffffffee8 = -in_stack_fffffffffffffee8;
    QMargins::bottom((QMargins *)0x401b08);
    QRect::adjust((QRect *)CONCAT44(iVar3,iVar2),in_stack_fffffffffffffedc,in_stack_fffffffffffffed8
                  ,in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
    in_stack_fffffffffffffeec = QRect::right((QRect *)0x401b34);
    in_stack_fffffffffffffef0 = QMargins::right((QMargins *)0x401b46);
    in_stack_fffffffffffffef0 = in_stack_fffffffffffffeec - in_stack_fffffffffffffef0;
    in_stack_fffffffffffffef4 = QMargins::left((QMargins *)0x401b60);
    in_stack_fffffffffffffef4 = in_stack_fffffffffffffef0 - in_stack_fffffffffffffef4;
    QPixmap::width();
    QRect::setRight((QRect *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
                    in_stack_fffffffffffffecc);
  }
  else if (in_EDX == 4) {
    iVar2 = QRect::right((QRect *)0x401a26);
    iVar3 = QMargins::right((QMargins *)0x401a38);
    in_stack_fffffffffffffefc = iVar2 - iVar3;
    QPixmap::width();
    QRect::top((QRect *)0x401a67);
    QMargins::top((QMargins *)0x401a79);
    QPixmap::width();
    QPixmap::height();
    QRect::setRect((QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                   in_stack_fffffffffffffee4,in_stack_fffffffffffffee0,in_stack_fffffffffffffedc,
                   in_stack_fffffffffffffed8);
  }
  QVar4 = QStyle::visualRect(in_stack_fffffffffffffefc,
                             (QRect *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (QRect *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
  ;
  QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x401bd6);
  QPixmapStylePixmap::~QPixmapStylePixmap((QPixmapStylePixmap *)0x401be3);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return QVar4;
}

Assistant:

QRect QPixmapStyle::comboBoxSubControlRect(const QStyleOptionComplex *option,
                                           QStyle::SubControl sc, const QWidget *) const
{
    Q_D(const QPixmapStyle);

    QRect r = option->rect; // Default size
    const QPixmapStylePixmap &pix = d->pixmaps.value(DD_ArrowEnabled);
    const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_ButtonEnabled);

    switch (sc) {
    case SC_ComboBoxArrow:
        r.setRect(r.right() - pix.margins.right() - pix.pixmap.width(),
                    r.top() + pix.margins.top(),
                    pix.pixmap.width(), pix.pixmap.height());
        break;
    case SC_ComboBoxEditField:
        r.adjust(desc.margins.left(), desc.margins.right(),
                 -desc.margins.right(), -desc.margins.bottom());
        r.setRight(r.right() - pix.margins.right() - pix.margins.left() - pix.pixmap.width());
        break;
    default:
        break;
    }

    r = visualRect(option->direction, option->rect, r);
    return r;
}